

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O3

string * cmEscapeQuotes_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (str._M_len != 0) {
    sVar1 = 0;
    do {
      if (str._M_str[sVar1] == '\"') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar1 = sVar1 + 1;
    } while (str._M_len != sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmEscapeQuotes(cm::string_view str)
{
  std::string result;
  result.reserve(str.size());
  for (const char ch : str) {
    if (ch == '"') {
      result += '\\';
    }
    result += ch;
  }
  return result;
}